

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::X86RAPass::emitLoad(X86RAPass *this,VirtReg *vReg,uint32_t id,char *reason)

{
  Error EVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  char *in_RDI;
  X86Mem src;
  X86Reg dst;
  char *comment;
  RACell *cell;
  uint32_t signature;
  VirtReg *in_stack_fffffffffffffde0;
  long in_stack_fffffffffffffe28;
  Operand_ *in_stack_fffffffffffffe30;
  undefined4 uVar2;
  X86Emitter *emitter;
  
  if (in_RDI[0x94] != '\0') {
    in_stack_fffffffffffffe28 = in_RSI;
    StringBuilder::setFormat
              ((StringBuilder *)(in_RDI + 0x2d0),"[%s] %s",in_RCX,*(undefined8 *)(in_RSI + 8));
    in_stack_fffffffffffffe30 = (Operand_ *)(in_RDI + 0x2d0);
  }
  uVar2 = *(undefined4 *)(in_RSI + 4);
  emitter = (X86Emitter *)&stack0xfffffffffffffde8;
  if (*(long *)(in_RSI + 0x28) == 0) {
    RAPass::_newVarCell((RAPass *)CONCAT44(in_EDX,uVar2),in_stack_fffffffffffffde0);
  }
  EVar1 = X86Internal::emitRegMove
                    (emitter,(Operand_ *)CONCAT44(uVar2,in_EDX),in_stack_fffffffffffffe30,
                     (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0),in_RDI);
  return EVar1;
}

Assistant:

Error X86RAPass::emitLoad(VirtReg* vReg, uint32_t id, const char* reason) {
  const char* comment = nullptr;
  if (_emitComments) {
    _stringBuilder.setFormat("[%s] %s", reason, vReg->getName());
    comment = _stringBuilder.getData();
  }

  X86Reg dst(X86Reg::fromSignature(vReg->getSignature(), id));
  X86Mem src(getVarMem(vReg));
  return X86Internal::emitRegMove(reinterpret_cast<X86Emitter*>(cc()), dst, src, vReg->getTypeId(), _avxEnabled, comment);
}